

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O1

string * namingConventions::getFileName(string *__return_storage_ptr__,string *filePath)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = (uint)filePath->_M_string_length;
  do {
    uVar3 = uVar1;
    uVar1 = uVar3 - 1;
  } while ((filePath->_M_dataplus)._M_p[uVar3 - 2] != '/');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (filePath->_M_string_length != (ulong)(uVar3 - 1)) {
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (filePath->_M_string_length != uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string namingConventions::getFileName(const std::string &filePath) {
    unsigned int pos = filePath.size() - 1;
    while (filePath[pos - 1] != '/') {
        pos -= 1;
    }
    std::string fileName;
    while (pos != filePath.size()) {
        fileName += filePath[pos];
        pos += 1;
    }
    return fileName;
}